

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

FDecalTemplate * __thiscall FDecalLib::GetDecalByNum(FDecalLib *this,WORD num)

{
  int iVar1;
  FDecalBase *pFVar2;
  undefined4 extraout_var;
  FDecalBase *base;
  WORD num_local;
  FDecalLib *this_local;
  
  if (num == 0) {
    this_local = (FDecalLib *)0x0;
  }
  else {
    pFVar2 = ScanTreeForNum(num,this->Root);
    if (pFVar2 == (FDecalBase *)0x0) {
      this_local = (FDecalLib *)0x0;
    }
    else {
      iVar1 = (**pFVar2->_vptr_FDecalBase)();
      this_local = (FDecalLib *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (FDecalTemplate *)this_local;
}

Assistant:

const FDecalTemplate *FDecalLib::GetDecalByNum (WORD num) const
{
	if (num == 0)
	{
		return NULL;
	}
	FDecalBase *base = ScanTreeForNum (num, Root);
	if (base != NULL)
	{
		return base->GetDecal ();
	}
	return NULL;
}